

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Company.cpp
# Opt level: O0

double __thiscall Company::averageEfficiency(Company *this)

{
  int iVar1;
  double dVar2;
  int local_1c;
  double dStack_18;
  int i;
  double average;
  Company *this_local;
  
  dStack_18 = 0.0;
  local_1c = 0;
  while( true ) {
    iVar1 = Boss::getNumberOfEmployees(this->boss);
    if (iVar1 <= local_1c) break;
    dVar2 = Employee::efficiency(this->employees[local_1c]);
    dStack_18 = dVar2 + dStack_18;
    local_1c = local_1c + 1;
  }
  iVar1 = Boss::getNumberOfEmployees(this->boss);
  return dStack_18 / (double)iVar1;
}

Assistant:

double Company::averageEfficiency() {
    double average = 0;
    for (int i = 0; i < boss->getNumberOfEmployees(); ++i) {
        average += employees[i]->efficiency();
    }
    average /= (boss->getNumberOfEmployees());
    return average;
}